

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

int __thiscall ncnn::Gemm::forward(Gemm *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RCX;
  reference in_RDX;
  long *in_RDI;
  int ret;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type *in_stack_ffffffffffffff18;
  value_type *in_stack_ffffffffffffff20;
  reference pvVar3;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_ffffffffffffff30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0 [2];
  undefined1 local_70 [24];
  undefined8 local_58;
  reference local_50;
  int local_38;
  undefined4 local_34;
  reference local_30;
  reference local_28;
  int local_18;
  undefined4 local_14;
  reference local_10;
  void *local_8;
  
  local_58 = in_RCX;
  local_50 = in_RDX;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1829cb3);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_ffffffffffffff30,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
             ,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1829cde);
  pvVar3 = local_50;
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x1829cfa);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar3,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),in_stack_ffffffffffffff20
             ,in_stack_ffffffffffffff18);
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x1829d1f);
  iVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_70,local_a0,local_58);
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a0,0);
  local_28 = local_50;
  pvVar3 = local_50;
  if (local_50 != local_30) {
    if (local_30->refcount != (int *)0x0) {
      piVar1 = local_30->refcount;
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_10 = local_50;
    if (local_50->refcount != (int *)0x0) {
      piVar1 = local_50->refcount;
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (local_50->allocator == (Allocator *)0x0) {
          local_8 = local_50->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (*local_50->allocator->_vptr_Allocator[3])(local_50->allocator,local_50->data);
        }
      }
    }
    local_50->data = (void *)0x0;
    local_50->elemsize = 0;
    local_50->elempack = 0;
    local_50->dims = 0;
    local_50->w = 0;
    local_50->h = 0;
    local_50->d = 0;
    local_50->c = 0;
    local_50->cstep = 0;
    local_50->refcount = (int *)0x0;
    pvVar3->data = local_30->data;
    pvVar3->refcount = local_30->refcount;
    pvVar3->elemsize = local_30->elemsize;
    pvVar3->elempack = local_30->elempack;
    pvVar3->allocator = local_30->allocator;
    pvVar3->dims = local_30->dims;
    pvVar3->w = local_30->w;
    pvVar3->h = local_30->h;
    pvVar3->d = local_30->d;
    pvVar3->c = local_30->c;
    pvVar3->cstep = local_30->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar3);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar3);
  return iVar2;
}

Assistant:

int Gemm::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_blobs(1, bottom_blob);
    std::vector<Mat> top_blobs(1, top_blob);
    int ret = forward(bottom_blobs, top_blobs, opt);
    top_blob = top_blobs[0];
    return ret;
}